

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Custom.h
# Opt level: O0

void __thiscall
Iir::Custom::SOSCascade<1,_Iir::DirectFormI>::SOSCascade
          (SOSCascade<1,_Iir::DirectFormI> *this,double (*sosCoefficients) [1] [6])

{
  double (*in_RDI) [1] [6];
  CascadeStages<1,_Iir::DirectFormI> *unaff_retaddr;
  
  CascadeStages<1,_Iir::DirectFormI>::CascadeStages(&this->super_CascadeStages<1,_Iir::DirectFormI>)
  ;
  CascadeStages<1,_Iir::DirectFormI>::setup(unaff_retaddr,in_RDI);
  return;
}

Assistant:

SOSCascade(const double (&sosCoefficients)[NSOS][6]) {
		CascadeStages<NSOS,StateType>::setup(sosCoefficients);
	}